

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  bool bVar1;
  element_type *this_00;
  OneHotEncoder *this_01;
  reference p_Var2;
  StringVector *this_02;
  string *this_03;
  string *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  OneHotEncoder *ohe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *container_local;
  OneHotEncoder *this_local;
  
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_onehotencoder(this_00);
  Specification::OneHotEncoder::clear_stringcategories(this_01);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(container);
  element.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&element.field_2 + 8));
    if (!bVar1) break;
    p_Var2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)&value,(string *)p_Var2);
    this_02 = Specification::OneHotEncoder::mutable_stringcategories(this_01);
    this_03 = Specification::StringVector::add_vector_abi_cxx11_(this_02);
    std::__cxx11::string::operator=((string *)this_03,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<std::string>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_stringcategories();
        
        for (auto element : container) {
            std::string *value = ohe->mutable_stringcategories()->add_vector();
            *value = element;
        }
        return Result();
    }